

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.h
# Opt level: O3

iterator __thiscall
cppcms::impl::details::
basic_map<std::__cxx11::string,int,hasher,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,int>>>
::find_in_range<std::__cxx11::string>
          (basic_map<std::__cxx11::string,int,hasher,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,int>>>
           *this,range_type *r,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k)

{
  pointer __s2;
  size_t __n;
  iterator pcVar1;
  int iVar2;
  iterator pcVar3;
  
  pcVar3 = r->first;
  if (pcVar3 != (iterator)0x0) {
    __s2 = (k->_M_dataplus)._M_p;
    __n = k->_M_string_length;
    pcVar1 = r->second;
    do {
      if ((pcVar3->val).first._M_string_length == __n) {
        if (__n == 0) {
          return pcVar3;
        }
        iVar2 = bcmp((pcVar3->val).first._M_dataplus._M_p,__s2,__n);
        if (iVar2 == 0) {
          return pcVar3;
        }
      }
    } while ((pcVar3 != pcVar1) && (pcVar3 = pcVar3->next, pcVar3 != (container *)0x0));
  }
  return (iterator)0x0;
}

Assistant:

iterator find_in_range(range_type &r,Kt const &k)
	{
		for(iterator p=r.first;p!=0;p=p->next) {
			Equals compare;
			if(compare(p->val.first,k)) {
				return p;
			}
			if(p==r.second)
				return 0;
		}
		return 0;
	}